

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasStringPieceFields(Descriptor *descriptor,Options *options)

{
  long lVar1;
  once_flag *__once;
  bool bVar2;
  CType CVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  bVar4 = 0 < *(int *)(descriptor + 4);
  if (0 < *(int *)(descriptor + 4)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x28);
      __once = *(once_flag **)(lVar1 + 0x18 + lVar5);
      if (__once != (once_flag *)0x0) {
        local_38 = FieldDescriptor::TypeOnceInit;
        local_40 = (FieldDescriptor *)(lVar1 + lVar5);
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_38,&local_40);
      }
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(lVar1 + 2 + lVar5) * 4) ==
           9) && (CVar3 = EffectiveStringCType((FieldDescriptor *)(lVar1 + lVar5),options),
                 CVar3 == FieldOptions_CType_STRING_PIECE)) {
        if (bVar4) {
          return true;
        }
        break;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x48;
      bVar4 = lVar6 < *(int *)(descriptor + 4);
    } while (lVar6 < *(int *)(descriptor + 4));
  }
  bVar4 = 0 < *(int *)(descriptor + 0x70);
  if ((0 < *(int *)(descriptor + 0x70)) &&
     (bVar2 = HasStringPieceFields(*(Descriptor **)(descriptor + 0x38),options), !bVar2)) {
    lVar6 = 0;
    lVar5 = 0x88;
    do {
      lVar6 = lVar6 + 1;
      bVar4 = lVar6 < *(int *)(descriptor + 0x70);
      if (*(int *)(descriptor + 0x70) <= lVar6) {
        return bVar4;
      }
      bVar2 = HasStringPieceFields((Descriptor *)(lVar5 + *(long *)(descriptor + 0x38)),options);
      lVar5 = lVar5 + 0x88;
    } while (!bVar2);
  }
  return bVar4;
}

Assistant:

static bool HasStringPieceFields(const Descriptor* descriptor,
                                 const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsStringPieceField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasStringPieceFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}